

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

VkImageLayout
vkt::memory::anon_unknown_0::getRandomNextLayout
          (Random *rng,Usage usage,VkImageLayout previousLayout)

{
  VkImageLayout layout_00;
  bool bVar1;
  deUint64 dVar2;
  ulong local_78;
  ulong uStack_60;
  VkImageLayout layout;
  size_t layoutNdx;
  size_t nextLayoutNdx;
  size_t supportedLayoutCount;
  VkImageLayout layouts [7];
  VkImageLayout previousLayout_local;
  Usage usage_local;
  Random *rng_local;
  
  layouts[0] = VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL;
  layouts[1] = VK_IMAGE_LAYOUT_DEPTH_STENCIL_READ_ONLY_OPTIMAL;
  layouts[2] = VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL;
  layouts[3] = VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL;
  layouts[4] = VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL;
  local_78 = getNumberOfSupportedLayouts(usage);
  dVar2 = de::Random::getUint64(rng);
  if (previousLayout != VK_IMAGE_LAYOUT_UNDEFINED) {
    local_78 = local_78 - 1;
  }
  layoutNdx = dVar2 % local_78;
  uStack_60 = 0;
  do {
    if (6 < uStack_60) {
      return VK_IMAGE_LAYOUT_UNDEFINED;
    }
    layout_00 = layouts[uStack_60 - 2];
    bVar1 = layoutSupportedByUsage(usage,layout_00);
    if ((bVar1) && (layout_00 != previousLayout)) {
      if (layoutNdx == 0) {
        return layout_00;
      }
      layoutNdx = layoutNdx - 1;
    }
    uStack_60 = uStack_60 + 1;
  } while( true );
}

Assistant:

vk::VkImageLayout getRandomNextLayout (de::Random&			rng,
									   Usage				usage,
									   vk::VkImageLayout	previousLayout)
{
	const vk::VkImageLayout	layouts[] =
	{
		vk::VK_IMAGE_LAYOUT_GENERAL,
		vk::VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
		vk::VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,
		vk::VK_IMAGE_LAYOUT_DEPTH_STENCIL_READ_ONLY_OPTIMAL,
		vk::VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL,
		vk::VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
		vk::VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
	};
	const size_t			supportedLayoutCount = getNumberOfSupportedLayouts(usage);

	DE_ASSERT(supportedLayoutCount > 0);

	size_t nextLayoutNdx = ((size_t)rng.getUint64()) % (previousLayout == vk::VK_IMAGE_LAYOUT_UNDEFINED
														? supportedLayoutCount
														: supportedLayoutCount - 1);

	for (size_t layoutNdx = 0; layoutNdx < DE_LENGTH_OF_ARRAY(layouts); layoutNdx++)
	{
		const vk::VkImageLayout layout = layouts[layoutNdx];

		if (layoutSupportedByUsage(usage, layout) && layout != previousLayout)
		{
			if (nextLayoutNdx == 0)
				return layout;
			else
				nextLayoutNdx--;
		}
	}

	DE_FATAL("Unreachable");
	return vk::VK_IMAGE_LAYOUT_UNDEFINED;
}